

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_certificate_policies(uchar **p,uchar *end,mbedtls_x509_sequence *certificate_policies)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  mbedtls_x509_sequence *pmVar4;
  uchar *end_00;
  uchar *puVar5;
  int local_3c;
  size_t local_38;
  size_t len;
  
  iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (iVar3 == 0) {
    end_00 = *p;
    if (local_38 != 0 && end_00 + local_38 == end) {
      local_3c = 0;
      do {
        if (end <= end_00) {
          certificate_policies->next = (mbedtls_asn1_sequence *)0x0;
          if (*p != end) {
            return -0x2566;
          }
          return local_3c;
        }
        iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
        if (iVar3 != 0) goto LAB_0020e5aa;
        end_00 = *p + local_38;
        iVar3 = mbedtls_asn1_get_tag(p,end_00,&local_38,6);
        sVar2 = local_38;
        if (iVar3 != 0) goto LAB_0020e5aa;
        piVar1 = (int *)*p;
        if ((local_38 != 4) || (*piVar1 != 0x201d55)) {
          local_3c = -0x2080;
        }
        pmVar4 = certificate_policies;
        if ((certificate_policies->buf).p != (uchar *)0x0) {
          if (certificate_policies->next != (mbedtls_asn1_sequence *)0x0) {
            return -0x2500;
          }
          pmVar4 = (mbedtls_x509_sequence *)calloc(1,0x20);
          certificate_policies->next = pmVar4;
          if (pmVar4 == (mbedtls_x509_sequence *)0x0) {
            return -0x256a;
          }
        }
        (pmVar4->buf).tag = 6;
        (pmVar4->buf).p = (uchar *)piVar1;
        (pmVar4->buf).len = sVar2;
        puVar5 = *p + sVar2;
        *p = puVar5;
        if (puVar5 < end_00) {
          iVar3 = mbedtls_asn1_get_tag(p,end_00,&local_38,0x30);
          if (iVar3 != 0) goto LAB_0020e5aa;
          puVar5 = *p + local_38;
          *p = puVar5;
        }
        certificate_policies = pmVar4;
      } while (puVar5 == end_00);
    }
    iVar3 = -0x2566;
  }
  else {
LAB_0020e5aa:
    iVar3 = iVar3 + -0x2500;
  }
  return iVar3;
}

Assistant:

static int x509_get_certificate_policies(unsigned char **p,
                                         const unsigned char *end,
                                         mbedtls_x509_sequence *certificate_policies)
{
    int ret, parse_ret = 0;
    size_t len;
    mbedtls_asn1_buf *buf;
    mbedtls_asn1_sequence *cur = certificate_policies;

    /* Get main sequence tag */
    ret = mbedtls_asn1_get_tag(p, end, &len,
                               MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE);
    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    /*
     * Cannot be an empty sequence.
     */
    if (len == 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    while (*p < end) {
        mbedtls_x509_buf policy_oid;
        const unsigned char *policy_end;

        /*
         * Get the policy sequence
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_end = *p + len;

        if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_oid.tag = MBEDTLS_ASN1_OID;
        policy_oid.len = len;
        policy_oid.p = *p;

        /*
         * Only AnyPolicy is currently supported when enforcing policy.
         */
        if (MBEDTLS_OID_CMP(MBEDTLS_OID_ANY_POLICY, &policy_oid) != 0) {
            /*
             * Set the parsing return code but continue parsing, in case this
             * extension is critical.
             */
            parse_ret = MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
        }

        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        buf = &(cur->buf);
        buf->tag = policy_oid.tag;
        buf->p = policy_oid.p;
        buf->len = policy_oid.len;

        *p += len;

        /*
         * If there is an optional qualifier, then *p < policy_end
         * Check the Qualifier len to verify it doesn't exceed policy_end.
         */
        if (*p < policy_end) {
            if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) !=
                0) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
            }
            /*
             * Skip the optional policy qualifiers.
             */
            *p += len;
        }

        if (*p != policy_end) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return parse_ret;
}